

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_35::InMemoryFile::truncate(InMemoryFile *this,char *__file,__off_t __length)

{
  int extraout_EAX;
  Impl *pIVar1;
  Impl *pIVar2;
  uchar *puVar3;
  Impl *pIVar4;
  undefined1 local_28 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t newSize_local;
  InMemoryFile *this_local;
  
  lock.ptr = (Impl *)__file;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
  pIVar2 = lock.ptr;
  pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
  pIVar4 = lock.ptr;
  if (pIVar2 < (Impl *)pIVar1->size) {
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
    Impl::modified(pIVar2);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
    puVar3 = Array<unsigned_char>::begin(&pIVar2->bytes);
    puVar3 = puVar3 + (long)lock.ptr;
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
    memset(puVar3,0,pIVar2->size - (long)lock.ptr);
    pIVar2 = lock.ptr;
    pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
    pIVar4->size = (size_t)pIVar2;
  }
  else {
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
    if ((Impl *)pIVar2->size < pIVar4) {
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
      Impl::modified(pIVar2);
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
      Impl::ensureCapacity(pIVar2,(size_t)lock.ptr);
      pIVar2 = lock.ptr;
      pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
      pIVar4->size = (size_t)pIVar2;
    }
  }
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_28);
  return extraout_EAX;
}

Assistant:

void truncate(uint64_t newSize) const override {
    auto lock = impl.lockExclusive();
    if (newSize < lock->size) {
      lock->modified();
      memset(lock->bytes.begin() + newSize, 0, lock->size - newSize);
      lock->size = newSize;
    } else if (newSize > lock->size) {
      lock->modified();
      lock->ensureCapacity(newSize);
      lock->size = newSize;
    }
  }